

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  bool in_DL;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  string local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  size_t local_48;
  size_type index;
  string expr;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)&index,id,in_DL);
  local_48 = ::std::__cxx11::string::find_first_of((char)&index,0x5b);
  uVar2 = ::std::__cxx11::string::size();
  if (2 < uVar2) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)&index);
    if (*pcVar3 == '(') {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)&index);
      if (*pcVar3 == '*') {
        CompilerGLSL::address_of_expression
                  ((CompilerGLSL *)&__range1,(string *)CONCAT44(in_register_00000034,id));
        ::std::__cxx11::string::operator=((string *)&index,(string *)&__range1);
        ::std::__cxx11::string::~string((string *)&__range1);
      }
    }
  }
  __end1._M_current = (char *)::std::__cxx11::string::begin();
  c = (char *)::std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (*pcVar4 == '.') {
      *pcVar4 = '_';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (local_48 == 0xffffffffffffffff) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_c0,(ulong)&index);
    ::std::__cxx11::string::substr((ulong)local_e0,(ulong)&index);
    ::std::operator+(local_100,local_c0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_100);
    ::std::__cxx11::string::~string((string *)local_100);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string((string *)local_c0);
  }
  ::std::__cxx11::string::~string((string *)&index);
  return this;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}